

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
boost::runtime::cla::parser::help
          (parser *this,ostream *ostr,parameters_store *parameters,cstring *param_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  element_type *peVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  basic_param_ptr param;
  trie_ptr local_110;
  pointer local_100;
  pointer local_f8;
  element_type *local_f0;
  shared_count local_e8;
  locate_result local_e0;
  cstring local_68;
  pointer local_50;
  pointer local_48;
  cstring local_40;
  
  if (param_name->m_end == param_name->m_begin) {
    std::__ostream_insert<char,std::char_traits<char>>(ostr,"Usage: ",7);
    paVar1 = &local_e0.first.m_prefix.field_2;
    local_e0.first.m_prefix._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,(this->m_program_name).m_begin,(this->m_program_name).m_end);
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,local_e0.first.m_prefix._M_dataplus._M_p,
               local_e0.first.m_prefix._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.first.m_prefix._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0.first.m_prefix._M_dataplus._M_p,
                      local_e0.first.m_prefix.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(ostr," [Boost.Test argument]... ",0x1a);
    sVar2 = (this->m_end_of_param_indicator)._M_string_length;
    if (sVar2 != 0) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (ostr,(this->m_end_of_param_indicator)._M_dataplus._M_p,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," [custom test module argument]...",0x21);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,
               "\n\nBoost.Test arguments correspond to parameters listed below. All parameters are optional. You can use specify parameter value either as a command line argument or as a value of corresponding environment variable. In case if argument for the same parameter is specified in both places, command line is taking precedence. Command line argument format supports parameter name guessing, so you can use any unambiguous prefix to identify a parameter."
               ,0x1be);
    if ((this->m_end_of_param_indicator)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(ostr," All the arguments after the ",0x1d);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (ostr,(this->m_end_of_param_indicator)._M_dataplus._M_p,
                          (this->m_end_of_param_indicator)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," are ignored by the Boost.Test.",0x1f);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,"\n\nBoost.Test supports following parameters:\n",0x2c);
    p_Var6 = (parameters->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var7 = &(parameters->m_parameters)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var7) {
      do {
        local_e0.first.m_prefix._M_dataplus._M_p = (pointer)p_Var6[1]._M_left;
        local_e0.first.m_prefix._M_string_length = (size_type)p_Var6[1]._M_right;
        if ((_Base_ptr)local_e0.first.m_prefix._M_string_length != (_Base_ptr)0x0) {
          LOCK();
          *(int *)&((_Base_ptr)local_e0.first.m_prefix._M_string_length)->_M_parent =
               *(int *)&((_Base_ptr)local_e0.first.m_prefix._M_string_length)->_M_parent + 1;
          UNLOCK();
        }
        if ((_Base_ptr)local_e0.first.m_prefix._M_dataplus._M_p == (_Base_ptr)0x0)
        goto LAB_0017f2f9;
        local_100 = (this->m_negation_prefix)._M_dataplus._M_p;
        local_f8 = local_100 + (this->m_negation_prefix)._M_string_length;
        (**(code **)(*(size_type *)local_e0.first.m_prefix._M_dataplus._M_p + 0x28))
                  (local_e0.first.m_prefix._M_dataplus._M_p,ostr,&local_100);
        detail::shared_count::~shared_count
                  ((shared_count *)&local_e0.first.m_prefix._M_string_length);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,
               "\nUse --help=<parameter name> to display detailed help for specific parameter.\n",
               0x4e);
  }
  else {
    pmVar4 = std::
             map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
             ::operator[](&this->m_param_trie,(key_type *)&help_prefix);
    local_110.px = pmVar4->px;
    local_110.pn.pi_ = (pmVar4->pn).pi_;
    if (local_110.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_110.pn.pi_)->use_count_ = (local_110.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_68.m_begin = param_name->m_begin;
    local_68.m_end = param_name->m_end;
    local_40.m_begin = "";
    local_40.m_end = "";
    locate_parameter(&local_e0,this,&local_110,&local_68,&local_40);
    peVar3 = local_e0.second.px;
    local_f0 = local_e0.second.px;
    local_e8.pi_ = local_e0.second.pn.pi_;
    local_e0.second.px = (element_type *)0x0;
    local_e0.second.pn.pi_ = (sp_counted_base *)0x0;
    detail::shared_count::~shared_count(&local_e0.second.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.first.m_value_separator._M_dataplus._M_p !=
        &local_e0.first.m_value_separator.field_2) {
      operator_delete(local_e0.first.m_value_separator._M_dataplus._M_p,
                      local_e0.first.m_value_separator.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.first.m_tag._M_dataplus._M_p != &local_e0.first.m_tag.field_2) {
      operator_delete(local_e0.first.m_tag._M_dataplus._M_p,
                      local_e0.first.m_tag.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.first.m_prefix._M_dataplus._M_p != &local_e0.first.m_prefix.field_2) {
      operator_delete(local_e0.first.m_prefix._M_dataplus._M_p,
                      local_e0.first.m_prefix.field_2._M_allocated_capacity + 1);
    }
    detail::shared_count::~shared_count(&local_110.pn);
    if (peVar3 == (element_type *)0x0) {
LAB_0017f2f9:
      __assert_fail("px != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                    ,0x2de,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::basic_param>::operator->() const [T = boost::runtime::basic_param]"
                   );
    }
    local_50 = (this->m_negation_prefix)._M_dataplus._M_p;
    local_48 = local_50 + (this->m_negation_prefix)._M_string_length;
    (*peVar3->_vptr_basic_param[6])(peVar3,ostr);
    detail::shared_count::~shared_count(&local_e8);
  }
  return;
}

Assistant:

void
    help( std::ostream& ostr, parameters_store const& parameters, cstring param_name )
    {
        if( !param_name.is_empty() ) {
            basic_param_ptr param = locate_parameter( m_param_trie[help_prefix], param_name, "" ).second;
            param->help( ostr, m_negation_prefix );
            return;
        }

        ostr << "Usage: " << m_program_name << " [Boost.Test argument]... ";
        if( !m_end_of_param_indicator.empty() )
            ostr << m_end_of_param_indicator << " [custom test module argument]...";

        ostr << "\n\nBoost.Test arguments correspond to parameters listed below. "
                "All parameters are optional. You can use specify parameter value either "
                "as a command line argument or as a value of corresponding environment "
                "variable. In case if argument for the same parameter is specified in both "
                "places, command line is taking precedence. Command line argument format "
                "supports parameter name guessing, so you can use any unambiguous "
                "prefix to identify a parameter.";
        if( !m_end_of_param_indicator.empty() )
            ostr << " All the arguments after the " << m_end_of_param_indicator << " are ignored by the Boost.Test.";

        ostr << "\n\nBoost.Test supports following parameters:\n";

        BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, parameters.all() ) {
            basic_param_ptr param = v.second;

            param->usage( ostr, m_negation_prefix );
        }

        ostr << "\nUse --help=<parameter name> to display detailed help for specific parameter.\n";
    }